

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O2

void embree::AccelN::occluded4
               (void *valid,Intersectors *This_in,RTCRay4 *ray,RayQueryContext *context)

{
  AccelData *pAVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  int iVar5;
  size_t i;
  ulong uVar6;
  
  pAVar1 = This_in->ptr;
  uVar6 = 0;
  do {
    lVar2 = *(long *)&pAVar1[3].type;
    if ((ulong)(*(long *)&pAVar1[3].field_0x58 - lVar2 >> 3) <= uVar6) {
      return;
    }
    lVar2 = *(long *)(lVar2 + uVar6 * 8);
    if (*(float *)(lVar2 + 0x10) < INFINITY) {
      uVar4 = (**(code **)(lVar2 + 0xa0))(valid,lVar2 + 0x58,ray,context);
      auVar3._4_4_ = -(uint)(0.0 <= ray->tfar[1]) & *(uint *)((long)valid + 4);
      auVar3._0_4_ = -(uint)(0.0 <= ray->tfar[0]) & *valid;
      auVar3._8_4_ = -(uint)(0.0 <= ray->tfar[2]) & *(uint *)((long)valid + 8);
      auVar3._12_4_ = -(uint)(0.0 <= ray->tfar[3]) & *(uint *)((long)valid + 0xc);
      iVar5 = movmskps(uVar4,auVar3);
      if (iVar5 == 0) {
        return;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void AccelN::occluded4 (const void* valid, Accel::Intersectors* This_in, RTCRay4& ray, RayQueryContext* context) 
  {
    AccelN* This = (AccelN*)This_in->ptr;
    for (size_t i=0; i<This->accels.size(); i++) {
      if (This->accels[i]->isEmpty()) continue;
      This->accels[i]->intersectors.occluded4(valid,ray,context);
#if defined(__SSE2__) || defined(__ARM_NEON)
      vbool4 valid0 = asBool(((vint4*)valid)[0]);
      vbool4 hit0   = ((vfloat4*)ray.tfar)[0] >= vfloat4(zero);
      if (unlikely(none(valid0 & hit0))) break;
#endif
    }
  }